

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

char * stb_shorten_path_readable(char *path,int len)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  int curlen;
  int curlen_00;
  int newlen;
  int iVar4;
  int iVar5;
  char *data;
  
  sVar2 = strlen(path);
  iVar5 = (int)sVar2;
  if (len < 0x401 && len < iVar5) {
    pcVar3 = stb_strrchr2(path,'/','\\');
    curlen = 0;
    if (pcVar3 != (char *)0x0) {
      curlen = ((int)pcVar3 - (int)path) + 1;
    }
    data = pcVar3 + 1;
    if (pcVar3 == (char *)0x0) {
      data = path;
    }
    curlen_00 = iVar5 - curlen;
    if (curlen < len >> 1) {
      iVar5 = len - curlen;
      newlen = curlen;
    }
    else if (curlen_00 < len >> 1) {
      newlen = len - curlen_00;
      iVar5 = curlen_00;
    }
    else {
      iVar4 = (curlen * len) / iVar5;
      iVar1 = len >> 2;
      newlen = iVar4;
      if (iVar4 <= iVar1) {
        newlen = iVar1;
      }
      iVar5 = (curlen_00 * len) / iVar5;
      if (iVar4 < iVar1) {
        iVar5 = len - iVar1;
      }
      if (iVar5 < iVar1) {
        newlen = len - iVar1;
      }
      if (iVar5 <= iVar1) {
        iVar5 = iVar1;
      }
    }
    if ((curlen < newlen) || (curlen_00 < iVar5)) {
      __assert_fail("r1 <= n1 && r2 <= n2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                    ,0x8fc,"char *stb_shorten_path_readable(char *, int)");
    }
    if (curlen != 0) {
      stb__add_section(stb_shorten_path_readable::buffer,path,curlen,newlen);
    }
    path = stb_shorten_path_readable::buffer;
    stb__add_section(stb_shorten_path_readable::buffer + newlen,data,curlen_00,iVar5);
    stb_shorten_path_readable::buffer[len] = '\0';
  }
  return path;
}

Assistant:

char * stb_shorten_path_readable(char *path, int len)
{
   static char buffer[1024];
   int n = strlen(path),n1,n2,r1,r2;
   char *s;
   if (n <= len) return path;
   if (len > 1024) return path;
   s = stb_strrchr2(path, '/', '\\');
   if (s) {
      n1 = s - path + 1;
      n2 = n - n1;
      ++s;
   } else {
      n1 = 0;
      n2 = n;
      s = path;
   }
   // now we need to reduce r1 and r2 so that they fit in len
   if (n1 < len>>1) {
      r1 = n1;
      r2 = len - r1;
   } else if (n2 < len >> 1) {
      r2 = n2;
      r1 = len - r2;
   } else {
      r1 = n1 * len / n;
      r2 = n2 * len / n;
      if (r1 < len>>2) r1 = len>>2, r2 = len-r1;
      if (r2 < len>>2) r2 = len>>2, r1 = len-r2;
   }
   assert(r1 <= n1 && r2 <= n2);
   if (n1)
      stb__add_section(buffer, path, n1, r1);
   stb__add_section(buffer+r1, s, n2, r2);
   buffer[len] = 0;
   return buffer;
}